

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

bool __thiscall
VulkanHppGenerator::isSupported
          (VulkanHppGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *requiredBy)

{
  _Rb_tree_node_base *name;
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = &(requiredBy->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (requiredBy->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var2; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    name = p_Var3 + 1;
    bVar1 = isSupportedFeature(this,(string *)name);
    if (bVar1) break;
    bVar1 = isSupportedExtension(this,(string *)name);
    if (bVar1) break;
    bVar1 = isUnsupportedFeature(this,(string *)name);
    if (!bVar1) {
      bVar1 = isUnsupportedExtension(this,(string *)name);
      if (!bVar1) {
        __assert_fail("isUnsupportedFeature( r ) || isUnsupportedExtension( r )",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                      ,0x346d,
                      "bool VulkanHppGenerator::isSupported(const std::set<std::string> &) const");
      }
    }
  }
  return (_Rb_tree_header *)p_Var3 != p_Var2;
}

Assistant:

bool VulkanHppGenerator::isSupported( std::set<std::string> const & requiredBy ) const
{
  for ( auto const & r : requiredBy )
  {
    if ( isSupportedFeature( r ) || isSupportedExtension( r ) )
    {
      return true;
    }
    else
    {
      assert( isUnsupportedFeature( r ) || isUnsupportedExtension( r ) );
    }
  }
  return false;
}